

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_select_node.cpp
# Opt level: O2

void __thiscall
duckdb::Binder::PrepareModifiers
          (Binder *this,OrderBinder *order_binder,QueryNode *statement,BoundQueryNode *result)

{
  OrderBinder *component;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Binder *this_00;
  undefined8 this_01;
  OrderType OVar2;
  pointer pRVar3;
  pointer pBVar4;
  reference pvVar5;
  pointer pPVar6;
  BaseExpression *this_02;
  StarExpression *pSVar7;
  pointer pBVar8;
  const_reference pvVar9;
  InternalException *this_03;
  idx_t i;
  pointer puVar10;
  DistinctModifier *pDVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_04;
  ulong uVar12;
  OrderBinder *pOVar13;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> _Var14;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> _Var15;
  pointer puVar16;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_05;
  OrderByNullType null_order;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> local_120;
  _Head_base<0UL,_duckdb::BoundDistinctModifier_*,_false> local_118;
  DistinctModifier *local_110;
  OrderType order_type;
  undefined7 uStack_107;
  undefined1 local_100 [56];
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  order_list;
  string local_70 [2];
  
  this_04 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (statement->modifiers).
            super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (statement->modifiers).
           super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_100._40_8_ = this;
  do {
    if (this_04 == p_Var1) {
      return;
    }
    local_118._M_head_impl = (BoundDistinctModifier *)0x0;
    pRVar3 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>::
             operator->((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                         *)this_04);
    switch(pRVar3->type) {
    case LIMIT_MODIFIER:
      pRVar3 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
               ::operator->((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                             *)this_04);
      ResultModifier::Cast<duckdb::LimitModifier>(pRVar3);
      BindLimit((Binder *)&order_list,(OrderBinder *)local_100._40_8_,(LimitModifier *)order_binder)
      ;
      break;
    case ORDER_MODIFIER:
      pRVar3 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
               ::operator->((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                             *)this_04);
      local_110 = (DistinctModifier *)ResultModifier::Cast<duckdb::OrderModifier>(pRVar3);
      make_uniq<duckdb::BoundOrderModifier>();
      local_100._48_8_ = DBConfig::GetConfig(*(ClientContext **)(local_100._40_8_ + 0x10));
      if ((long)(((vector<duckdb::OrderByNode,_true> *)&local_110->distinct_on_targets)->
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>).
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(((vector<duckdb::OrderByNode,_true> *)&local_110->distinct_on_targets)->
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>).
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x10) {
        local_100._8_8_ = &local_110->distinct_on_targets;
        pvVar5 = vector<duckdb::OrderByNode,_true>::get<true>
                           ((vector<duckdb::OrderByNode,_true> *)local_100._8_8_,0);
        pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(&pvVar5->expression);
        if ((pPVar6->super_BaseExpression).type != STAR) goto LAB_0129b770;
        pvVar5 = vector<duckdb::OrderByNode,_true>::get<true>
                           ((vector<duckdb::OrderByNode,_true> *)local_100._8_8_,0);
        this_02 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(&pvVar5->expression)->super_BaseExpression;
        pSVar7 = BaseExpression::Cast<duckdb::StarExpression>(this_02);
        if ((((pSVar7->exclude_list)._M_h._M_element_count != 0) ||
            ((pSVar7->replace_list)._M_h._M_element_count != 0)) ||
           ((pSVar7->expr).
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (ParsedExpression *)0x0)) goto LAB_0129b770;
        pvVar5 = vector<duckdb::OrderByNode,_true>::get<true>
                           ((vector<duckdb::OrderByNode,_true> *)local_100._8_8_,0);
        OVar2 = DBConfig::ResolveOrder((DBConfig *)local_100._48_8_,pvVar5->type);
        local_110 = (DistinctModifier *)CONCAT71(local_110._1_7_,OVar2);
        _order_type = (element_type *)CONCAT71(uStack_107,OVar2);
        pvVar5 = vector<duckdb::OrderByNode,_true>::get<true>
                           ((vector<duckdb::OrderByNode,_true> *)local_100._8_8_,0);
        null_order = DBConfig::ResolveNullOrder
                               ((DBConfig *)local_100._48_8_,(OrderType)local_110,pvVar5->null_order
                               );
        Value::Value((Value *)&order_list,"ALL");
        make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                  ((duckdb *)local_100,(Value *)&order_list);
        Value::~Value((Value *)&order_list);
        pBVar8 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                 ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                               *)&local_120);
        ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
        emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                  ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                   &pBVar8->orders,&order_type,&null_order,
                   (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                    *)local_100);
        _Var15._M_head_impl = local_118._M_head_impl;
        local_118._M_head_impl = local_120._M_head_impl;
        local_120._M_head_impl = (BoundDistinctModifier *)0x0;
        if ((element_type *)_Var15._M_head_impl != (element_type *)0x0) {
          (**(code **)((long)((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                               *)&(((weak_ptr<duckdb::Binder,_true> *)
                                   &((_Var15._M_head_impl)->super_BoundResultModifier).
                                    _vptr_BoundResultModifier)->internal).
                                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>
                      + 8))();
        }
        _Var14._M_head_impl = (BoundDistinctModifier *)local_100._0_8_;
        _Var15._M_head_impl = local_120._M_head_impl;
        if ((element_type *)local_100._0_8_ != (element_type *)0x0) goto LAB_0129b8d3;
      }
      else {
LAB_0129b770:
        pDVar11 = (DistinctModifier *)
                  (((vector<duckdb::OrderByNode,_true> *)&local_110->distinct_on_targets)->
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>).
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_110 = (DistinctModifier *)
                    (((vector<duckdb::OrderByNode,_true> *)&local_110->distinct_on_targets)->
                    super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>).
                    super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        local_100._8_8_ = this_04;
        while( true ) {
          if (pDVar11 == local_110) break;
          order_list.
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          order_list.
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          order_list.
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar9 = vector<std::reference_wrapper<duckdb::Binder>,_true>::get<true>
                             (&order_binder->binders,0);
          this_00 = pvVar9->_M_data;
          local_100._16_8_ = *(undefined8 *)&(pDVar11->super_ResultModifier).type;
          *(undefined8 *)&(pDVar11->super_ResultModifier).type = 0;
          ExpandStarExpression
                    (this_00,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)(local_100 + 0x10),&order_list);
          if ((ClientContext *)local_100._16_8_ != (ClientContext *)0x0) {
            (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&(((element_type *)
                               (((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                  *)local_100._16_8_)->
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8
                      ))->_M_pi)();
          }
          this_01 = local_100._48_8_;
          local_100._16_8_ = (ClientContext *)0x0;
          OVar2 = DBConfig::ResolveOrder
                            ((DBConfig *)local_100._48_8_,
                             *(OrderType *)&(pDVar11->super_ResultModifier)._vptr_ResultModifier);
          _order_type = (element_type *)CONCAT71(uStack_107,OVar2);
          pOVar13 = (OrderBinder *)(ulong)OVar2;
          null_order = DBConfig::ResolveNullOrder
                                 ((DBConfig *)this_01,OVar2,
                                  *(OrderByNullType *)
                                   ((long)&(pDVar11->super_ResultModifier)._vptr_ResultModifier + 1)
                                 );
          puVar10 = order_list.
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar16 = order_list.
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar10;
              puVar16 = puVar16 + 1) {
            local_100._24_8_ =
                 (puVar16->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (puVar16->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)0x0;
            BindOrderExpression((Binder *)local_100,pOVar13,
                                (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)order_binder);
            if ((SelectBindState *)local_100._24_8_ != (SelectBindState *)0x0) {
              (**(code **)((long)((BaseExpression *)local_100._24_8_)->_vptr_BaseExpression + 8))();
            }
            local_100._24_8_ = (SelectBindState *)0x0;
            if ((element_type *)local_100._0_8_ != (element_type *)0x0) {
              pBVar8 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                       ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                                     *)&local_120);
              pOVar13 = (OrderBinder *)&order_type;
              ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
              emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                        ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>
                          *)&pBVar8->orders,(OrderType *)pOVar13,&null_order,
                         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)local_100);
              if ((element_type *)local_100._0_8_ != (element_type *)0x0) {
                (**(code **)((long)&((((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                        *)&(((enable_shared_from_this<duckdb::Binder> *)
                                            local_100._0_8_)->__weak_this_).internal.
                                           super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->
                                     super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>).
                                    _M_head_impl)->super_BaseExpression + 8))();
              }
            }
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ::~vector(&order_list.
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   );
          pDVar11 = (DistinctModifier *)&pDVar11->distinct_on_targets;
        }
        pBVar8 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                 ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                               *)&local_120);
        _Var14._M_head_impl = local_118._M_head_impl;
        _Var15._M_head_impl = local_120._M_head_impl;
        this_04 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
        if ((pBVar8->orders).
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pBVar8->orders).
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_120._M_head_impl = (BoundDistinctModifier *)0x0;
          local_118._M_head_impl = _Var15._M_head_impl;
          if ((element_type *)_Var14._M_head_impl == (element_type *)0x0) goto LAB_0129b8e9;
LAB_0129b8d3:
          (**(code **)((long)&((((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                  *)&(((element_type *)_Var14._M_head_impl)->
                                     super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                                     internal.
                                     super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->
                               super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>).
                              _M_head_impl)->super_BaseExpression + 8))();
          _Var15._M_head_impl = local_120._M_head_impl;
        }
      }
      goto LAB_0129b8de;
    case DISTINCT_MODIFIER:
      pRVar3 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
               ::operator->((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                             *)this_04);
      local_110 = ResultModifier::Cast<duckdb::DistinctModifier>(pRVar3);
      local_100._8_8_ = this_04;
      make_uniq<duckdb::BoundDistinctModifier>();
      pDVar11 = local_110;
      puVar10 = (local_110->distinct_on_targets).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar16 = (local_110->distinct_on_targets).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pBVar4 = unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
               ::operator->((unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                             *)&local_120);
      (pBVar4->super_BoundResultModifier).field_0x9 = puVar10 != puVar16;
      if ((pDVar11->distinct_on_targets).
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (pDVar11->distinct_on_targets).
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this_05 = &local_110->distinct_on_targets;
        for (uVar12 = 0;
            uVar12 < (ulong)((long)(result->names).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(result->names).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar12 = uVar12 + 1) {
          Value::INTEGER((Value *)&order_list,(int)uVar12 + 1);
          make_uniq<duckdb::ConstantExpression,duckdb::Value>
                    ((duckdb *)&order_type,(Value *)&order_list);
          local_100._0_8_ = _order_type;
          _order_type = (element_type *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)this_05,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_100);
          if ((element_type *)local_100._0_8_ != (element_type *)0x0) {
            (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&(((((enable_shared_from_this<duckdb::Binder> *)local_100._0_8_)->
                                __weak_this_).internal.
                                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8))->
                      _M_pi)();
          }
          local_100._0_8_ = (element_type *)0x0;
          if (_order_type != (element_type *)0x0) {
            (*(code *)(((pointer)_order_type)->_M_data->
                      super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            )();
          }
          _order_type = (element_type *)0x0;
          Value::~Value((Value *)&order_list);
        }
      }
      component = (OrderBinder *)(local_70 + 1);
      ::std::__cxx11::string::string((string *)component,"DISTINCT ON",(allocator *)&order_list);
      pOVar13 = component;
      OrderBinder::SetQueryComponent(order_binder,(string *)component);
      ::std::__cxx11::string::~string((string *)component);
      puVar16 = (local_110->distinct_on_targets).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar10 = (local_110->distinct_on_targets).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar16;
          puVar10 = puVar10 + 1) {
        local_100._32_8_ =
             (puVar10->
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (puVar10->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)0x0;
        BindOrderExpression((Binder *)&order_list,pOVar13,
                            (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)order_binder);
        if ((ParsedExpression *)local_100._32_8_ != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)local_100._32_8_ + 8))();
        }
        local_100._32_8_ = (pointer)0x0;
        if (order_list.
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          pBVar4 = unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                   ::operator->((unique_ptr<duckdb::BoundDistinctModifier,_std::default_delete<duckdb::BoundDistinctModifier>,_true>
                                 *)&local_120);
          pOVar13 = (OrderBinder *)&order_list;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&pBVar4->target_distincts,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)pOVar13);
          if (order_list.
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)((long)&(((order_list.
                                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                 )._M_t.
                                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl)->super_BaseExpression + 8))();
          }
        }
      }
      local_70[0]._M_dataplus._M_p = (pointer)&local_70[0].field_2;
      local_70[0]._M_string_length = 0;
      local_70[0].field_2._M_local_buf[0] = '\0';
      OrderBinder::SetQueryComponent(order_binder,local_70);
      ::std::__cxx11::string::~string((string *)local_70);
      this_04 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
      _Var15._M_head_impl = local_118._M_head_impl;
      local_118._M_head_impl = local_120._M_head_impl;
      local_120._M_head_impl = (BoundDistinctModifier *)0x0;
      if (((element_type *)_Var15._M_head_impl != (element_type *)0x0) &&
         ((**(code **)((long)((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                               *)&(((weak_ptr<duckdb::Binder,_true> *)
                                   &((_Var15._M_head_impl)->super_BoundResultModifier).
                                    _vptr_BoundResultModifier)->internal).
                                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>
                      + 8))(), (element_type *)local_120._M_head_impl != (element_type *)0x0)) {
        (**(code **)((long)((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                             *)&(((weak_ptr<duckdb::Binder,_true> *)
                                 &((local_120._M_head_impl)->super_BoundResultModifier).
                                  _vptr_BoundResultModifier)->internal).
                                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> + 8))();
      }
      goto LAB_0129b8e9;
    case LIMIT_PERCENT_MODIFIER:
      pRVar3 = unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
               ::operator->((unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                             *)this_04);
      ResultModifier::Cast<duckdb::LimitPercentModifier>(pRVar3);
      BindLimitPercent((Binder *)&order_list,(OrderBinder *)local_100._40_8_,
                       (LimitPercentModifier *)order_binder);
      break;
    default:
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&order_list,"Unsupported result modifier",(allocator *)&local_120);
      InternalException::InternalException(this_03,(string *)&order_list);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    _Var15._M_head_impl = local_118._M_head_impl;
    local_118._M_head_impl =
         (BoundDistinctModifier *)
         order_list.
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
LAB_0129b8de:
    if ((element_type *)_Var15._M_head_impl != (element_type *)0x0) {
      (**(code **)((long)&((((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                              *)&(((element_type *)_Var15._M_head_impl)->
                                 super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                                 internal.
                                 super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>).
                          _M_head_impl)->super_BaseExpression + 8))();
    }
LAB_0129b8e9:
    if (((element_type *)local_118._M_head_impl != (element_type *)0x0) &&
       (::std::
        vector<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,std::default_delete<duckdb::BoundResultModifier>,true>>>
                    *)&result->modifiers,
                   (unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>
                    *)&local_118), (element_type *)local_118._M_head_impl != (element_type *)0x0)) {
      (**(code **)((long)((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                           *)&(((weak_ptr<duckdb::Binder,_true> *)
                               &((local_118._M_head_impl)->super_BoundResultModifier).
                                _vptr_BoundResultModifier)->internal).
                              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> + 8))();
    }
    this_04 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this_04->_M_use_count;
  } while( true );
}

Assistant:

void Binder::PrepareModifiers(OrderBinder &order_binder, QueryNode &statement, BoundQueryNode &result) {
	for (auto &mod : statement.modifiers) {
		unique_ptr<BoundResultModifier> bound_modifier;
		switch (mod->type) {
		case ResultModifierType::DISTINCT_MODIFIER: {
			auto &distinct = mod->Cast<DistinctModifier>();
			auto bound_distinct = make_uniq<BoundDistinctModifier>();
			bound_distinct->distinct_type =
			    distinct.distinct_on_targets.empty() ? DistinctType::DISTINCT : DistinctType::DISTINCT_ON;
			if (distinct.distinct_on_targets.empty()) {
				for (idx_t i = 0; i < result.names.size(); i++) {
					distinct.distinct_on_targets.push_back(
					    make_uniq<ConstantExpression>(Value::INTEGER(UnsafeNumericCast<int32_t>(1 + i))));
				}
			}
			order_binder.SetQueryComponent("DISTINCT ON");
			for (auto &distinct_on_target : distinct.distinct_on_targets) {
				auto expr = BindOrderExpression(order_binder, std::move(distinct_on_target));
				if (!expr) {
					continue;
				}
				bound_distinct->target_distincts.push_back(std::move(expr));
			}
			order_binder.SetQueryComponent();

			bound_modifier = std::move(bound_distinct);
			break;
		}
		case ResultModifierType::ORDER_MODIFIER: {

			auto &order = mod->Cast<OrderModifier>();
			auto bound_order = make_uniq<BoundOrderModifier>();
			auto &config = DBConfig::GetConfig(context);
			D_ASSERT(!order.orders.empty());
			auto &order_binders = order_binder.GetBinders();
			if (order.orders.size() == 1 && order.orders[0].expression->GetExpressionType() == ExpressionType::STAR) {
				auto &star = order.orders[0].expression->Cast<StarExpression>();
				if (star.exclude_list.empty() && star.replace_list.empty() && !star.expr) {
					// ORDER BY ALL
					// replace the order list with the all elements in the SELECT list
					auto order_type = config.ResolveOrder(order.orders[0].type);
					auto null_order = config.ResolveNullOrder(order_type, order.orders[0].null_order);
					auto constant_expr = make_uniq<BoundConstantExpression>(Value("ALL"));
					bound_order->orders.emplace_back(order_type, null_order, std::move(constant_expr));
					bound_modifier = std::move(bound_order);
					break;
				}
			}
#if 0
			// When this verification is enabled, replace ORDER BY x, y with ORDER BY create_sort_key(x, y)
			// note that we don't enable this during actual verification since it doesn't always work
			// e.g. it breaks EXPLAIN output on queries
			bool can_replace = true;
			for (auto &order_node : order.orders) {
				if (order_node.expression->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
					// we cannot replace the sort key when we order by literals (e.g. ORDER BY 1, 2`
					can_replace = false;
					break;
				}
			}
			if (!order_binder.HasExtraList()) {
				// we can only do the replacement when we can order by elements that are not in the selection list
				can_replace = false;
			}
			if (can_replace) {
				vector<unique_ptr<ParsedExpression>> sort_key_parameters;
				for (auto &order_node : order.orders) {
					sort_key_parameters.push_back(std::move(order_node.expression));
					auto type = config.ResolveOrder(order_node.type);
					auto null_order = config.ResolveNullOrder(type, order_node.null_order);
					string sort_param = EnumUtil::ToString(type) + " " + EnumUtil::ToString(null_order);
					sort_key_parameters.push_back(make_uniq<ConstantExpression>(Value(sort_param)));
				}
				order.orders.clear();
				auto create_sort_key = make_uniq<FunctionExpression>("create_sort_key", std::move(sort_key_parameters));
				order.orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_LAST, std::move(create_sort_key));
			}
#endif
			for (auto &order_node : order.orders) {
				vector<unique_ptr<ParsedExpression>> order_list;
				order_binders[0].get().ExpandStarExpression(std::move(order_node.expression), order_list);

				auto type = config.ResolveOrder(order_node.type);
				auto null_order = config.ResolveNullOrder(type, order_node.null_order);
				for (auto &order_expr : order_list) {
					auto bound_expr = BindOrderExpression(order_binder, std::move(order_expr));
					if (!bound_expr) {
						continue;
					}
					bound_order->orders.emplace_back(type, null_order, std::move(bound_expr));
				}
			}
			if (!bound_order->orders.empty()) {
				bound_modifier = std::move(bound_order);
			}
			break;
		}
		case ResultModifierType::LIMIT_MODIFIER:
			bound_modifier = BindLimit(order_binder, mod->Cast<LimitModifier>());
			break;
		case ResultModifierType::LIMIT_PERCENT_MODIFIER:
			bound_modifier = BindLimitPercent(order_binder, mod->Cast<LimitPercentModifier>());
			break;
		default:
			throw InternalException("Unsupported result modifier");
		}
		if (bound_modifier) {
			result.modifiers.push_back(std::move(bound_modifier));
		}
	}
}